

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendCo(Gia_Man_t *p,int iLit0)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint v;
  ulong uVar5;
  
  if ((-1 < iLit0) && (v = (uint)iLit0 >> 1, (int)v < p->nObjs)) {
    pGVar3 = Gia_ManObj(p,v);
    if ((~*(uint *)pGVar3 & 0x1fffffff) == 0 || -1 < (int)*(uint *)pGVar3) {
      pGVar3 = Gia_ManAppendObj(p);
      pGVar3->field_0x3 = pGVar3->field_0x3 | 0x80;
      iVar2 = Gia_ObjId(p,pGVar3);
      uVar4 = (ulong)(iVar2 - v & 0x1fffffff);
      uVar1 = *(ulong *)pGVar3;
      uVar5 = (ulong)((iLit0 & 1U) << 0x1d);
      *(ulong *)pGVar3 = uVar5 | uVar1 & 0xffffffffc0000000 | uVar4;
      *(ulong *)pGVar3 =
           uVar5 | uVar1 & 0xe0000000c0000000 | uVar4 | (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20
      ;
      p_00 = p->vCos;
      iVar2 = Gia_ObjId(p,pGVar3);
      Vec_IntPush(p_00,iVar2);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),pGVar3);
      }
      iVar2 = Gia_ObjId(p,pGVar3);
      return iVar2;
    }
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendCo( Gia_Man_t * p, int iLit0 )  
{ 
    Gia_Obj_t * pObj;
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( !Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0))) );
    pObj = Gia_ManAppendObj( p );    
    pObj->fTerm = 1;
    pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
    pObj->fCompl0 = Abc_LitIsCompl(iLit0);
    pObj->iDiff1  = Vec_IntSize( p->vCos );
    Vec_IntPush( p->vCos, Gia_ObjId(p, pObj) );
    if ( p->pFanData )
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
    return Gia_ObjId( p, pObj ) << 1;
}